

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

String __thiscall testing::internal::WideStringToUtf8(internal *this,wchar_t *str,int num_chars)

{
  undefined8 uVar1;
  size_t sVar2;
  size_t extraout_RDX;
  ulong uVar3;
  String SVar4;
  stringstream local_1e0 [8];
  stringstream stream;
  ostream local_1d0 [112];
  ios_base local_160 [264];
  char local_58 [8];
  char buffer [32];
  
  buffer._24_8_ = this;
  if (num_chars == -1) {
    sVar2 = wcslen(str);
    num_chars = (int)sVar2;
  }
  std::__cxx11::stringstream::stringstream(local_1e0);
  if (0 < num_chars) {
    uVar3 = 0;
    do {
      if (str[uVar3] == L'\0') break;
      CodePointToUtf8(str[uVar3],local_58);
      sVar2 = strlen(local_58);
      std::__ostream_insert<char,std::char_traits<char>>(local_1d0,local_58,sVar2);
      uVar3 = uVar3 + 1;
    } while ((uint)num_chars != uVar3);
  }
  uVar1 = buffer._24_8_;
  StringStreamToString((internal *)buffer._24_8_,(stringstream *)local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1e0);
  std::ios_base::~ios_base(local_160);
  SVar4.length_ = extraout_RDX;
  SVar4.c_str_ = (char *)uVar1;
  return SVar4;
}

Assistant:

String WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    UInt32 unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<UInt32>(str[i]);
    }

    char buffer[32];  // CodePointToUtf8 requires a buffer this big.
    stream << CodePointToUtf8(unicode_code_point, buffer);
  }
  return StringStreamToString(&stream);
}